

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
emplaceRealloc<slang::ast::ConditionalExpression::Condition>
          (SmallVectorBase<slang::ast::ConditionalExpression::Condition> *this,pointer pos,
          Condition *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  Pattern *pPVar4;
  undefined8 uVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar3 = this->cap;
  if (uVar11 < uVar3 * 2) {
    uVar11 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pCVar8 = (pointer)operator_new(uVar11 << 4);
  pPVar4 = args->pattern;
  *(undefined8 *)((long)pCVar8 + lVar12) = (args->expr).ptr;
  ((undefined8 *)((long)pCVar8 + lVar12))[1] = pPVar4;
  p = this->data_;
  lVar9 = this->len * 0x10;
  lVar10 = (long)p + (lVar9 - (long)pos);
  pCVar6 = p;
  pCVar7 = pCVar8;
  if (lVar10 == 0) {
    if (this->len != 0) {
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->expr).ptr + lVar10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pCVar8->expr).ptr + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 != lVar10);
    }
  }
  else {
    for (; pCVar6 != pos; pCVar6 = pCVar6 + 1) {
      pPVar4 = pCVar6->pattern;
      (pCVar7->expr).ptr = (pCVar6->expr).ptr;
      pCVar7->pattern = pPVar4;
      pCVar7 = pCVar7 + 1;
    }
    memcpy((void *)((long)pCVar8 + lVar12 + 0x10),pos,(lVar10 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pCVar8;
  return (pointer)((long)pCVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}